

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

cmCommand * __thiscall cmState::GetCommand(cmState *this,string *name)

{
  const_iterator cVar1;
  cmCommand *pcVar2;
  string sName;
  string local_30;
  
  cmsys::SystemTools::LowerCase(&local_30,name);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
          ::find(&(this->Commands)._M_t,&local_30);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->Commands)._M_t._M_impl.super__Rb_tree_header) {
    pcVar2 = (cmCommand *)0x0;
  }
  else {
    pcVar2 = *(cmCommand **)(cVar1._M_node + 2);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return pcVar2;
}

Assistant:

cmCommand* cmState::GetCommand(std::string const& name) const
{
  cmCommand* command = 0;
  std::string sName = cmSystemTools::LowerCase(name);
  std::map<std::string, cmCommand*>::const_iterator pos =
      this->Commands.find(sName);
  if (pos != this->Commands.end())
    {
    command = (*pos).second;
    }
  return command;
}